

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.cpp
# Opt level: O2

ExpansionBlock permutationBox(ExpansionBlock block)

{
  size_t sVar1;
  long lVar2;
  size_t sVar3;
  bool bVar4;
  reference local_60;
  reference local_50;
  ExpansionBlock result;
  ExpansionBlock block_local;
  
  result.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0;
  sVar3 = 0x1f;
  block_local.super__Base_bitset<1UL>._M_w = block.super__Base_bitset<1UL>._M_w;
  for (sVar1 = 0; sVar1 != 0x10; sVar1 = sVar1 + 1) {
    local_60._M_wp = (_WordT *)&result;
    local_60._M_bpos = sVar1;
    local_50._M_wp = (_WordT *)&block_local;
    local_50._M_bpos = sVar3;
    std::bitset<32UL>::reference::operator=(&local_60,&local_50);
    sVar3 = sVar3 - 1;
  }
  sVar3 = 0x10;
  lVar2 = 8;
  while (bVar4 = lVar2 != 0, lVar2 = lVar2 + -1, bVar4) {
    local_50._M_bpos = (size_t)((int)sVar3 + 0x38U & 0x3f);
    local_60._M_wp = (_WordT *)&result;
    local_60._M_bpos = sVar3;
    local_50._M_wp = (_WordT *)&block_local;
    std::bitset<32UL>::reference::operator=(&local_60,&local_50);
    sVar3 = sVar3 + 1;
  }
  sVar3 = 0x18;
  for (sVar1 = 7; sVar1 != 0xffffffffffffffff; sVar1 = sVar1 - 1) {
    local_60._M_wp = (_WordT *)&result;
    local_60._M_bpos = sVar3;
    local_50._M_wp = (_WordT *)&block_local;
    local_50._M_bpos = sVar1;
    std::bitset<32UL>::reference::operator=(&local_60,&local_50);
    sVar3 = sVar3 + 1;
  }
  return (ExpansionBlock)result.super__Base_bitset<1UL>._M_w._M_w;
}

Assistant:

ExpansionBlock permutationBox(ExpansionBlock block) {
    ExpansionBlock result;
    int i = 0;
    for ( ; i < EXPANSION_BLOCK_SIZE / 2; i++) {
        result[i] = block[EXPANSION_BLOCK_SIZE- i - 1];
    }

    for ( ; i < (EXPANSION_BLOCK_SIZE / 4) * 3; i++) {
        result[i] = block[i - 8];
    }

    for ( ; i < EXPANSION_BLOCK_SIZE; i++) {
        result[i] = block[EXPANSION_BLOCK_SIZE - i - 1];
    }

    return result;
}